

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::DirectStateAccess::Queries::CreationTest::iterate(CreationTest *this)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  ContextType ctxType;
  deUint32 dVar6;
  undefined4 extraout_var;
  long lVar8;
  int *piVar9;
  char *description;
  long lVar10;
  qpTestResult testResult;
  TestContext *this_00;
  bool bVar11;
  GLuint queries_legacy [2];
  GLuint queries_dsa [7] [2];
  int local_200 [3];
  undefined4 local_1f4;
  CreationTest *local_1f0;
  int local_1e8 [14];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x154);
  local_1f0 = this;
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar2) || (bVar3)) {
    local_200[0] = 0;
    local_200[1] = 0;
    local_1e8[0xc] = 0;
    local_1e8[0xd] = 0;
    local_1e8[8] = 0;
    local_1e8[9] = 0;
    local_1e8[10] = 0;
    local_1e8[0xb] = 0;
    local_1e8[4] = 0;
    local_1e8[5] = 0;
    local_1e8[6] = 0;
    local_1e8[7] = 0;
    local_1e8[0] = 0;
    local_1e8[1] = 0;
    local_1e8[2] = 0;
    local_1e8[3] = 0;
    (**(code **)(lVar7 + 0x6e0))(2,local_200);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glGenQueries have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                    ,0x71);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    piVar9 = local_200;
    bVar3 = true;
    bVar2 = true;
    do {
      bVar11 = bVar2;
      cVar4 = (**(code **)(lVar7 + 0xca0))(*piVar9);
      if (cVar4 != '\0') {
        local_1b0._0_8_ = ((local_1f0->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "GenQueries has created default objects, but it should create only a names.",0x4a
                  );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        bVar3 = false;
      }
      piVar9 = local_200 + 1;
      bVar2 = false;
    } while (bVar11);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    lVar10 = 0;
    do {
      (**(code **)(lVar7 + 0x3d8))(ErrorsTest::s_targets[lVar10],2,local_1e8 + lVar10 * 2);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"glCreateQueries have failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                      ,0x85);
      lVar8 = 0;
      bVar2 = true;
      do {
        bVar11 = bVar2;
        cVar4 = (**(code **)(lVar7 + 0xca0))((local_1e8 + lVar10 * 2)[lVar8]);
        if (cVar4 == '\0') {
          local_1b0._0_8_ = ((local_1f0->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"CreateQueries has not created default objects.",0x2e);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
          bVar3 = false;
        }
        lVar8 = 1;
        bVar2 = false;
      } while (bVar11);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 7);
    local_1f4 = 0;
    lVar10 = 0;
    piVar9 = local_200;
    bVar2 = true;
    do {
      bVar11 = bVar2;
      if (*piVar9 != 0) {
        (**(code **)(lVar7 + 0x458))(1);
        *piVar9 = 0;
      }
      lVar8 = 0;
      do {
        if (*(int *)((long)local_1e8 + lVar8 + lVar10 * 4) != 0) {
          (**(code **)(lVar7 + 0x458))(1);
          *(undefined4 *)((long)local_1e8 + lVar8 + lVar10 * 4) = 0;
        }
        lVar8 = lVar8 + 8;
      } while (lVar8 != 0x38);
      lVar10 = 1;
      piVar9 = local_200 + 1;
      bVar2 = false;
    } while (bVar11);
    this_00 = (local_1f0->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar3) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else if ((char)local_1f4 == '\0') {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      description = "Error";
      testResult = QP_TEST_RESULT_INTERNAL_ERROR;
    }
  }
  else {
    this_00 = (local_1f0->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CreationTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Query targets */
	static const glw::GLenum targets[] = {
		GL_SAMPLES_PASSED, GL_ANY_SAMPLES_PASSED,   GL_ANY_SAMPLES_PASSED_CONSERVATIVE,		 GL_TIME_ELAPSED,
		GL_TIMESTAMP,	  GL_PRIMITIVES_GENERATED, GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN
	};
	static const glw::GLuint targets_count = sizeof(targets) / sizeof(targets[0]);

	/* Queries objects */
	static const glw::GLuint queries_count = 2;

	glw::GLuint queries_legacy[queries_count]			  = {};
	glw::GLuint queries_dsa[targets_count][queries_count] = {};

	try
	{
		/* Check legacy state creation. */
		gl.genQueries(queries_count, queries_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenQueries have failed");

		for (glw::GLuint i = 0; i < queries_count; ++i)
		{
			if (gl.isQuery(queries_legacy[i]))
			{
				is_ok = false;

				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "GenQueries has created default objects, but it should create only a names."
					<< tcu::TestLog::EndMessage;
			}
		}

		/* Check direct state creation. */
		for (glw::GLuint i = 0; i < targets_count; ++i)
		{
			gl.createQueries(targets[i], queries_count, queries_dsa[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateQueries have failed");

			for (glw::GLuint j = 0; j < queries_count; ++j)
			{
				if (!gl.isQuery(queries_dsa[i][j]))
				{
					is_ok = false;

					/* Log. */
					m_context.getTestContext().getLog() << tcu::TestLog::Message
														<< "CreateQueries has not created default objects."
														<< tcu::TestLog::EndMessage;
				}
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	for (glw::GLuint j = 0; j < queries_count; ++j)
	{
		if (queries_legacy[j])
		{
			gl.deleteQueries(1, &queries_legacy[j]);

			queries_legacy[j] = 0;
		}

		for (glw::GLuint i = 0; i < targets_count; ++i)
		{
			if (queries_dsa[i][j])
			{
				gl.deleteQueries(1, &queries_dsa[i][j]);

				queries_dsa[i][j] = 0;
			}
		}
	}

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}